

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

FILE * file_open(lemon *lemp,char *suffix,char *mode)

{
  char *pcVar1;
  FILE *fp;
  char *mode_local;
  char *suffix_local;
  lemon *lemp_local;
  
  if (lemp->outname != (char *)0x0) {
    free(lemp->outname);
  }
  pcVar1 = file_makename(lemp,suffix);
  lemp->outname = pcVar1;
  lemp_local = (lemon *)fopen(lemp->outname,mode);
  if ((lemp_local == (lemon *)0x0) && (*mode == 'w')) {
    fprintf(_stderr,"Can\'t open file \"%s\".\n",lemp->outname);
    lemp->errorcnt = lemp->errorcnt + 1;
    lemp_local = (lemon *)0x0;
  }
  return (FILE *)lemp_local;
}

Assistant:

PRIVATE FILE *file_open(
  struct lemon *lemp,
  const char *suffix,
  const char *mode
){
  FILE *fp;

  if( lemp->outname ) free(lemp->outname);
  lemp->outname = file_makename(lemp, suffix);
  fp = fopen(lemp->outname,mode);
  if( fp==0 && *mode=='w' ){
    fprintf(stderr,"Can't open file \"%s\".\n",lemp->outname);
    lemp->errorcnt++;
    return 0;
  }
  return fp;
}